

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall Graphics::Graphics(Graphics *this,int startScore,string *startRoom)

{
  int startScore_00;
  GameTitle *this_00;
  value_type this_01;
  value_type local_60;
  GameTitle *local_58 [3];
  string local_40 [32];
  string *local_20;
  string *startRoom_local;
  Graphics *pGStack_10;
  int startScore_local;
  Graphics *this_local;
  
  local_20 = startRoom;
  startRoom_local._4_4_ = startScore;
  pGStack_10 = this;
  std::vector<Animation_*,_std::allocator<Animation_*>_>::vector(&this->animations);
  startScore_00 = startRoom_local._4_4_;
  std::__cxx11::string::string(local_40,(string *)startRoom);
  Screen::Screen(&this->screen,startScore_00,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  this_00 = (GameTitle *)operator_new(0x108);
  GameTitle::GameTitle(this_00);
  local_58[0] = this_00;
  std::vector<Animation_*,_std::allocator<Animation_*>_>::push_back
            (&this->animations,(value_type *)local_58);
  this_01 = (value_type)operator_new(0x48);
  *(undefined8 *)&this_01->field_0x30 = 0;
  *(undefined8 *)&this_01->field_0x38 = 0;
  *(undefined8 *)&this_01->field_0x20 = 0;
  *(undefined8 *)&this_01->description = 0;
  *(undefined8 *)&this_01->field_0x10 = 0;
  *(undefined8 *)&this_01->field_0x18 = 0;
  ((Animation *)&this_01->_vptr_Animation)->_vptr_Animation = (_func_int **)0x0;
  *(undefined8 *)&this_01->name = 0;
  *(undefined8 *)&this_01->field_0x40 = 0;
  Fireworks::Fireworks((Fireworks *)this_01);
  local_60 = this_01;
  std::vector<Animation_*,_std::allocator<Animation_*>_>::push_back(&this->animations,&local_60);
  return;
}

Assistant:

Graphics::Graphics(int startScore, std::string startRoom) : screen(startScore, startRoom)
{
    // Create the animations array
    animations.push_back(new GameTitle());
    animations.push_back(new Fireworks());

    // TODO: Create the menus
}